

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFilteringTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::TextureCubeArrayFilteringCase::init
          (TextureCubeArrayFilteringCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
  *pvVar1;
  int iVar2;
  TextureCubeArray *tex_;
  bool bVar3;
  ContextType ctxType;
  int extraout_EAX;
  TextureCubeArray *pTVar4;
  RenderTarget *pRVar5;
  NotSupportedError *this_00;
  int layerFaceNdx_1;
  int iVar6;
  uint uVar7;
  int layerFaceNdx;
  uint uVar8;
  ulong uVar9;
  float fVar10;
  IVec4 swz;
  Vec4 gMin;
  PixelBufferAccess levelBuf;
  Vector<float,_4> local_178;
  ulong local_160;
  int local_158;
  int local_154;
  RGBA local_150;
  RGBA local_14c;
  Vec4 gMax;
  undefined8 local_138;
  undefined8 uStack_130;
  ulong local_120;
  PixelBufferAccess local_118;
  Vec4 cBias;
  Vec4 cScale;
  TextureFormat texFmt;
  TextureFormatInfo fmtInfo;
  Vector<int,_4> local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Vector<float,_4> local_40;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar3) {
    bVar3 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_texture_cube_map_array");
    if (!bVar3) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fmtInfo,"GL_EXT_texture_cube_map_array not supported",
                 (allocator<char> *)&local_88);
      tcu::NotSupportedError::NotSupportedError(this_00,(string *)&fmtInfo);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  texFmt = glu::mapGLInternalFormat(this->m_internalFormat);
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  tcu::operator-((tcu *)&cScale,&fmtInfo.valueMax,&fmtInfo.valueMin);
  tcu::Vector<float,_4>::Vector(&cBias,&fmtInfo.valueMin);
  uVar8 = this->m_size;
  uVar7 = 0x20;
  if (uVar8 != 0) {
    uVar7 = 0x1f;
    if (uVar8 != 0) {
      for (; uVar8 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar7 = uVar7 ^ 0x1f;
  }
  iVar6 = this->m_depth;
  pTVar4 = (TextureCubeArray *)operator_new(0x68);
  glu::TextureCubeArray::TextureCubeArray
            (pTVar4,((this->super_TestCase).m_context)->m_renderCtx,this->m_internalFormat,uVar8,
             iVar6);
  this->m_gradientTex = pTVar4;
  pTVar4 = (TextureCubeArray *)operator_new(0x68);
  local_158 = iVar6;
  local_154 = iVar6 / 6;
  glu::TextureCubeArray::TextureCubeArray
            (pTVar4,((this->super_TestCase).m_context)->m_renderCtx,this->m_internalFormat,
             this->m_size,this->m_depth);
  uVar7 = 0x20 - uVar7;
  this->m_gridTex = pTVar4;
  local_88.m_data[0] = 0;
  local_88.m_data[1] = 1;
  local_88.m_data[2] = 2;
  local_88.m_data[3] = 3;
  local_78 = 0x100000002;
  uStack_70 = 3;
  local_68 = 3;
  uStack_60 = 0x200000001;
  local_58 = 0x300000001;
  uStack_50 = 2;
  local_120 = (ulong)uVar7;
  uVar9 = 0;
  while (uVar9 != local_120) {
    tcu::TextureCubeArray::allocLevel(&this->m_gradientTex->m_refTexture,(int)uVar9);
    local_160 = uVar9;
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&levelBuf.super_ConstPixelBufferAccess,
               &(this->m_gradientTex->m_refTexture).super_TextureLevelPyramid.m_access.
                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar9].super_ConstPixelBufferAccess);
    for (uVar8 = 0; (int)uVar8 < this->m_depth; uVar8 = uVar8 + 1) {
      tcu::Vector<int,_4>::Vector
                (&swz,(Vector<int,_4> *)((long)local_88.m_data + (ulong)((uVar8 & 3) << 4)));
      local_178.m_data[0] = 0.0;
      local_178.m_data[1] = 0.0;
      local_178.m_data[2] = 0.0;
      local_178.m_data[3] = 1.0;
      gMax.m_data[0] = local_178.m_data[swz.m_data[0]];
      gMax.m_data[1] = local_178.m_data[swz.m_data[1]];
      gMax.m_data[2] = local_178.m_data[swz.m_data[2]];
      gMax.m_data[3] = local_178.m_data[swz.m_data[3]];
      tcu::operator*((tcu *)&local_118,(Vector<float,_4> *)&gMax,&cScale);
      tcu::operator+((tcu *)&gMin,(Vector<float,_4> *)&local_118,&cBias);
      local_138 = 0x3f8000003f800000;
      uStack_130 = 0x3f800000;
      local_178.m_data[1] = *(float *)((long)&local_138 + (long)swz.m_data[1] * 4);
      local_178.m_data[0] = *(float *)((long)&local_138 + (long)swz.m_data[0] * 4);
      local_178.m_data[3] = *(float *)((long)&local_138 + (long)swz.m_data[3] * 4);
      local_178.m_data[2] = *(float *)((long)&local_138 + (long)swz.m_data[2] * 4);
      tcu::operator*((tcu *)&local_118,&local_178,&cScale);
      tcu::operator+((tcu *)&gMax,(Vector<float,_4> *)&local_118,&cBias);
      tcu::getSubregion(&local_118,&levelBuf,0,0,uVar8,
                        levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0],
                        levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1],1);
      tcu::fillWithComponentGradients(&local_118,&gMin,&gMax);
    }
    uVar9 = local_160 + 1;
  }
  uVar9 = 0;
  while (uVar9 != local_120) {
    tcu::TextureCubeArray::allocLevel(&this->m_gridTex->m_refTexture,(int)uVar9);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&levelBuf.super_ConstPixelBufferAccess,
               &(this->m_gridTex->m_refTexture).super_TextureLevelPyramid.m_access.
                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar9].super_ConstPixelBufferAccess);
    local_160 = uVar9;
    for (iVar6 = 0; iVar2 = this->m_depth, iVar6 < iVar2; iVar6 = iVar6 + 1) {
      tcu::getSubregion(&local_118,&levelBuf,0,0,iVar6,
                        levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0],
                        levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1],1);
      uVar8 = (int)(0xffffff / (long)(int)(iVar2 * uVar7 + -1)) * (int)uVar9;
      local_14c.m_value = uVar8 | 0xff000000;
      tcu::RGBA::toVec(&local_14c);
      tcu::operator*((tcu *)&gMin,&gMax,&cScale);
      tcu::operator+((tcu *)&swz,&gMin,&cBias);
      local_150.m_value = ~uVar8 | 0xff000000;
      tcu::RGBA::toVec(&local_150);
      tcu::operator*((tcu *)&local_138,&local_40,&cScale);
      tcu::operator+((tcu *)&local_178,(Vector<float,_4> *)&local_138,&cBias);
      tcu::fillWithGrid(&local_118,4,(Vec4 *)&swz,(Vec4 *)&local_178);
      uVar9 = (ulong)((int)uVar9 + uVar7);
    }
    uVar9 = local_160 + 1;
  }
  glu::TextureCubeArray::upload(this->m_gradientTex);
  glu::TextureCubeArray::upload(this->m_gridTex);
  iVar6 = local_154;
  pTVar4 = this->m_gradientTex;
  tex_ = this->m_gridTex;
  if (this->m_onlySampleFaceInterior == true) {
    local_118.super_ConstPixelBufferAccess.m_format.order = 0xbf4ccccd;
    local_118.super_ConstPixelBufferAccess.m_format.type = 0xbf4ccccd;
    fVar10 = (float)local_154 + 0.5;
    swz.m_data[0] = 0x3f4ccccd;
    swz.m_data[1] = 0x3f4ccccd;
    gMin.m_data[1] = fVar10;
    gMin.m_data[0] = -0.5;
    FilterCase::FilterCase
              ((FilterCase *)&levelBuf,pTVar4,(Vec2 *)&local_118,(Vec2 *)&swz,(Vec2 *)&gMin);
    pvVar1 = &this->m_cases;
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
              (pvVar1,(FilterCase *)&levelBuf);
    local_118.super_ConstPixelBufferAccess.m_format.order = 0x3f000000;
    local_118.super_ConstPixelBufferAccess.m_format.type = 0x3f266666;
    swz.m_data[0] = 0x3f4ccccd;
    swz.m_data[1] = 0x3f4ccccd;
    gMin.m_data[0] = -0.5;
    FilterCase::FilterCase
              ((FilterCase *)&levelBuf,pTVar4,(Vec2 *)&local_118,(Vec2 *)&swz,(Vec2 *)&gMin);
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
              (pvVar1,(FilterCase *)&levelBuf);
    local_118.super_ConstPixelBufferAccess.m_format.order = 0xbf4ccccd;
    local_118.super_ConstPixelBufferAccess.m_format.type = 0xbf4ccccd;
    swz.m_data[0] = 0x3f4ccccd;
    swz.m_data[1] = 0x3f4ccccd;
    gMin.m_data[1] = -0.5;
    gMin.m_data[0] = fVar10;
    FilterCase::FilterCase
              ((FilterCase *)&levelBuf,tex_,(Vec2 *)&local_118,(Vec2 *)&swz,(Vec2 *)&gMin);
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
              (pvVar1,(FilterCase *)&levelBuf);
    local_118.super_ConstPixelBufferAccess.m_format.order = 0x3e4ccccd;
    local_118.super_ConstPixelBufferAccess.m_format.type = 0x3e4ccccd;
    swz.m_data[0] = 0x3f19999a;
    swz.m_data[1] = 0x3f000000;
    gMin.m_data[1] = -0.5;
    FilterCase::FilterCase
              ((FilterCase *)&levelBuf,tex_,(Vec2 *)&local_118,(Vec2 *)&swz,(Vec2 *)&gMin);
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
              (pvVar1,(FilterCase *)&levelBuf);
  }
  else {
    pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar2 = pRVar5->m_numSamples;
    fVar10 = (float)iVar6 + 0.5;
    if (iVar2 == 0) {
      local_118.super_ConstPixelBufferAccess.m_format.order = 0xbfa00000;
      local_118.super_ConstPixelBufferAccess.m_format.type = 0xbf99999a;
      swz.m_data[0] = 0x3f99999a;
      swz.m_data[1] = 0x3fa00000;
      gMin.m_data[1] = fVar10;
      gMin.m_data[0] = -0.5;
      FilterCase::FilterCase
                ((FilterCase *)&levelBuf,pTVar4,(Vec2 *)&local_118,(Vec2 *)&swz,(Vec2 *)&gMin);
      std::
      vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
      ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
                (&this->m_cases,(FilterCase *)&levelBuf);
    }
    else {
      local_118.super_ConstPixelBufferAccess.m_format.order = 0xbf9851ec;
      local_118.super_ConstPixelBufferAccess.m_format.type = 0xbfa66666;
      swz.m_data[0] = 0x3f8ccccd;
      swz.m_data[1] = 0x3faccccd;
      gMin.m_data[1] = fVar10;
      gMin.m_data[0] = -0.5;
      FilterCase::FilterCase
                ((FilterCase *)&levelBuf,pTVar4,(Vec2 *)&local_118,(Vec2 *)&swz,(Vec2 *)&gMin);
      std::
      vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
      ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
                (&this->m_cases,(FilterCase *)&levelBuf);
    }
    local_118.super_ConstPixelBufferAccess.m_format.order = 0x3f4ccccd;
    local_118.super_ConstPixelBufferAccess.m_format.type = 0x3f4ccccd;
    swz.m_data[0] = 0x3fa00000;
    swz.m_data[1] = 0x3f99999a;
    gMin.m_data[1] = fVar10;
    gMin.m_data[0] = -0.5;
    FilterCase::FilterCase
              ((FilterCase *)&levelBuf,pTVar4,(Vec2 *)&local_118,(Vec2 *)&swz,(Vec2 *)&gMin);
    pvVar1 = &this->m_cases;
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
              (pvVar1,(FilterCase *)&levelBuf);
    local_118.super_ConstPixelBufferAccess.m_format.order = 0xbf9851ec;
    local_118.super_ConstPixelBufferAccess.m_format.type = 0xbfa66666;
    swz.m_data[0] = 0x3f8ccccd;
    swz.m_data[1] = 0x3faccccd;
    gMin.m_data[1] = -0.5;
    gMin.m_data[0] = fVar10;
    FilterCase::FilterCase
              ((FilterCase *)&levelBuf,tex_,(Vec2 *)&local_118,(Vec2 *)&swz,(Vec2 *)&gMin);
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
              (pvVar1,(FilterCase *)&levelBuf);
    local_118.super_ConstPixelBufferAccess.m_format.order = 0xbf99999a;
    local_118.super_ConstPixelBufferAccess.m_format.type = 0xbf8ccccd;
    swz.m_data[0] = -0x40b33333;
    swz.m_data[1] = -0x40b33333;
    gMin.m_data[1] = -0.5;
    FilterCase::FilterCase
              ((FilterCase *)&levelBuf,tex_,(Vec2 *)&local_118,(Vec2 *)&swz,(Vec2 *)&gMin);
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
              (pvVar1,(FilterCase *)&levelBuf);
    if (0xb < local_158 && iVar2 == 0) {
      local_118.super_ConstPixelBufferAccess.m_format.order = 0xc0000000;
      local_118.super_ConstPixelBufferAccess.m_format.type = 0xbfc00000;
      swz.m_data[0] = -0x42333333;
      swz.m_data[1] = 0x3f666666;
      gMin.m_data[0] = 1.50001;
      gMin.m_data[1] = 1.49999;
      FilterCase::FilterCase
                ((FilterCase *)&levelBuf,pTVar4,(Vec2 *)&local_118,(Vec2 *)&swz,(Vec2 *)&gMin);
      std::
      vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
      ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
                (pvVar1,(FilterCase *)&levelBuf);
    }
  }
  this->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void TextureCubeArrayFilteringCase::init (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_cube_map_array"))
		throw tcu::NotSupportedError("GL_EXT_texture_cube_map_array not supported");

	try
	{
		const tcu::TextureFormat		texFmt		= glu::mapGLInternalFormat(m_internalFormat);
		const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
		const tcu::Vec4					cScale		= fmtInfo.valueMax-fmtInfo.valueMin;
		const tcu::Vec4					cBias		= fmtInfo.valueMin;
		const int						numLevels	= deLog2Floor32(m_size) + 1;
		const int						numLayers	= m_depth / 6;

		// Create textures.
		m_gradientTex	= new glu::TextureCubeArray(m_context.getRenderContext(), m_internalFormat, m_size, m_depth);
		m_gridTex		= new glu::TextureCubeArray(m_context.getRenderContext(), m_internalFormat, m_size, m_depth);

		const tcu::IVec4 levelSwz[] =
		{
			tcu::IVec4(0,1,2,3),
			tcu::IVec4(2,1,3,0),
			tcu::IVec4(3,0,1,2),
			tcu::IVec4(1,3,2,0),
		};

		// Fill first gradient texture (gradient direction varies between layers).
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			m_gradientTex->getRefTexture().allocLevel(levelNdx);

			const tcu::PixelBufferAccess levelBuf = m_gradientTex->getRefTexture().getLevel(levelNdx);

			for (int layerFaceNdx = 0; layerFaceNdx < m_depth; layerFaceNdx++)
			{
				const tcu::IVec4	swz		= levelSwz[layerFaceNdx % DE_LENGTH_OF_ARRAY(levelSwz)];
				const tcu::Vec4		gMin	= tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f).swizzle(swz[0],swz[1],swz[2],swz[3])*cScale + cBias;
				const tcu::Vec4		gMax	= tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f).swizzle(swz[0],swz[1],swz[2],swz[3])*cScale + cBias;

				tcu::fillWithComponentGradients(tcu::getSubregion(levelBuf, 0, 0, layerFaceNdx, levelBuf.getWidth(), levelBuf.getHeight(), 1), gMin, gMax);
			}
		}

		// Fill second with grid texture (each layer has unique colors).
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			m_gridTex->getRefTexture().allocLevel(levelNdx);

			const tcu::PixelBufferAccess levelBuf = m_gridTex->getRefTexture().getLevel(levelNdx);

			for (int layerFaceNdx = 0; layerFaceNdx < m_depth; layerFaceNdx++)
			{
				const deUint32	step	= 0x00ffffff / (numLevels*m_depth - 1);
				const deUint32	rgb		= step * (levelNdx + layerFaceNdx*numLevels);
				const deUint32	colorA	= 0xff000000 | rgb;
				const deUint32	colorB	= 0xff000000 | ~rgb;

				tcu::fillWithGrid(tcu::getSubregion(levelBuf, 0, 0, layerFaceNdx, levelBuf.getWidth(), levelBuf.getHeight(), 1),
								  4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
			}
		}

		// Upload.
		m_gradientTex->upload();
		m_gridTex->upload();

		// Test cases
		{
			const glu::TextureCubeArray* const	tex0	= m_gradientTex;
			const glu::TextureCubeArray* const	tex1	= m_gridTex;

			if (m_onlySampleFaceInterior)
			{
				m_cases.push_back(FilterCase(tex0, tcu::Vec2(-0.8f, -0.8f),	tcu::Vec2(0.8f,  0.8f),	tcu::Vec2(-0.5f, float(numLayers)+0.5f)));	// minification
				m_cases.push_back(FilterCase(tex0, tcu::Vec2(0.5f, 0.65f),	tcu::Vec2(0.8f,  0.8f),	tcu::Vec2(-0.5f, float(numLayers)+0.5f)));	// magnification
				m_cases.push_back(FilterCase(tex1, tcu::Vec2(-0.8f, -0.8f),	tcu::Vec2(0.8f,  0.8f),	tcu::Vec2(float(numLayers)+0.5f, -0.5f)));	// minification
				m_cases.push_back(FilterCase(tex1, tcu::Vec2(0.2f, 0.2f),	tcu::Vec2(0.6f,  0.5f),	tcu::Vec2(float(numLayers)+0.5f, -0.5f)));	// magnification
			}
			else
			{
				const bool isSingleSample = (m_context.getRenderTarget().getNumSamples() == 0);

				// minification - w/ tweak to avoid hitting triangle edges with a face switchpoint in multisample configs
				if (isSingleSample)
					m_cases.push_back(FilterCase(tex0, tcu::Vec2(-1.25f, -1.2f), tcu::Vec2(1.2f, 1.25f), tcu::Vec2(-0.5f, float(numLayers)+0.5f)));
				else
					m_cases.push_back(FilterCase(tex0, tcu::Vec2(-1.19f, -1.3f), tcu::Vec2(1.1f, 1.35f), tcu::Vec2(-0.5f, float(numLayers)+0.5f)));

				m_cases.push_back(FilterCase(tex0, tcu::Vec2(0.8f, 0.8f),		tcu::Vec2(1.25f, 1.20f),	tcu::Vec2(-0.5f, float(numLayers)+0.5f)));	// magnification
				m_cases.push_back(FilterCase(tex1, tcu::Vec2(-1.19f, -1.3f),	tcu::Vec2(1.1f, 1.35f),		tcu::Vec2(float(numLayers)+0.5f, -0.5f)));	// minification
				m_cases.push_back(FilterCase(tex1, tcu::Vec2(-1.2f, -1.1f),		tcu::Vec2(-0.8f, -0.8f),	tcu::Vec2(float(numLayers)+0.5f, -0.5f)));	// magnification

				// Layer rounding - only in single-sample configs as multisample configs may produce smooth transition at the middle.
				if (isSingleSample && (numLayers > 1))
					m_cases.push_back(FilterCase(tex0,	tcu::Vec2(-2.0f, -1.5f  ),	tcu::Vec2(-0.1f,  0.9f), tcu::Vec2(1.50001f, 1.49999f)));
			}
		}

		m_caseNdx = 0;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	catch (...)
	{
		// Clean up to save memory.
		TextureCubeArrayFilteringCase::deinit();
		throw;
	}
}